

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hh
# Opt level: O0

void __thiscall kratos::Context::Context(Context *this)

{
  Context *this_local;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>_>
  ::unordered_map(&this->modules_);
  std::
  unordered_map<const_kratos::Generator_*,_unsigned_long,_std::hash<const_kratos::Generator_*>,_std::equal_to<const_kratos::Generator_*>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>_>
  ::unordered_map(&this->generator_hash_);
  this->max_instance_id_ = 0;
  this->max_stmt_id_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::map(&this->enum_defs_);
  std::
  unordered_set<std::shared_ptr<kratos::Generator>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ::unordered_set(&this->empty_generators_);
  this->track_generated_ = false;
  std::
  unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  ::unordered_set(&this->tracked_generators_);
  return;
}

Assistant:

Context() = default;